

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::EndExecution(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint depth;
  FunctionBody *this_local;
  
  if (this->m_DEBUG_executionCount < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x524,"(m_DEBUG_executionCount > 0)",
                                "Must have a previous execution to end");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->m_DEBUG_executionCount = this->m_DEBUG_executionCount + -1;
  uVar3 = InterlockedDecrement<unsigned_int>(&this->m_depth);
  if ((uVar3 == 0) && ((*(uint *)&this->field_0x178 >> 7 & 1) != 0)) {
    *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffff7f;
    ReleaseLoopHeaders(this);
  }
  return;
}

Assistant:

void
    FunctionBody::EndExecution()
    {
#if DBG
        AssertMsg(m_DEBUG_executionCount > 0, "Must have a previous execution to end");

        m_DEBUG_executionCount--;
#endif
        uint depth = ::InterlockedDecrement(&this->m_depth);

        // If loop headers were determined to be no longer needed
        // during the execution of the function, we release them now
        if (depth == 0 && this->m_pendingLoopHeaderRelease)
        {
            this->m_pendingLoopHeaderRelease = false;
            ReleaseLoopHeaders();
        }
    }